

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPMCanvas.h
# Opt level: O2

void __thiscall
adapt::gpm2::detail::GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D>::Flush
          (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this)

{
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *pGVar1;
  GPMCanvas *this_00;
  NotInitialized *this_01;
  undefined8 in_RCX;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string c;
  string local_50;
  
  if (this->mCanvas != (GPMCanvas *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&c,"plot",(allocator<char> *)&local_90);
    pGVar1 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
             (this->mParam).
             super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
                   (this->mParam).
                   super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != pGVar1;
        this_02 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
                  &this_02[0xb].mParam.
                   super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
      PlotCommand_abi_cxx11_
                (&local_50,this_02,(GPMGraphParam2D *)(ulong)this->mCanvas->mInMemoryDataTransfer,
                 SUB81(in_RCX,0));
      std::operator+(&local_90,&local_50,", ");
      std::__cxx11::string::append((string *)&c);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::erase
              (&c,c._M_dataplus._M_p + (c._M_string_length - 2),
               c._M_dataplus._M_p + c._M_string_length);
    GPMCanvas::Command<std::__cxx11::string&>(this->mCanvas,&c);
    this_00 = this->mCanvas;
    InitCommand_abi_cxx11_();
    GPMCanvas::Command<std::__cxx11::string>(this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&c);
    return;
  }
  this_01 = (NotInitialized *)__cxa_allocate_exception(0x28);
  adapt::cuf::NotInitialized::Exception(this_01,"Buffer is empty");
  __cxa_throw(this_01,&adapt::cuf::NotInitialized::typeinfo,adapt::cuf::Exception::~Exception);
}

Assistant:

inline void GPMPlotBuffer2D<GraphParam>::Flush()
{
	if (mCanvas == nullptr) throw NotInitialized("Buffer is empty");
	std::string c = "plot";
	for (auto& i : mParam)
	{
		c += PlotCommand(i, mCanvas->IsInMemoryDataTransferEnabled()) + ", ";
	}
	c.erase(c.end() - 2, c.end());
	mCanvas->Command(c);
	mCanvas->Command(InitCommand());
}